

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_limit.cpp
# Opt level: O0

bool __thiscall ON_SubDFace::GetQuadSurface(ON_SubDFace *this,ON_NurbsSurface *nurbs_surface)

{
  bool bVar1;
  uint local_2c;
  double dStack_28;
  uint i;
  double k;
  ON_NurbsSurface *nurbs_surface_local;
  ON_SubDFace *this_local;
  
  bVar1 = ON_NurbsSurface::Create(nurbs_surface,3,false,4,4,4,4);
  if (bVar1) {
    bVar1 = GetQuadSurface(this,nurbs_surface->m_cv,(long)nurbs_surface->m_cv_stride[0],
                           (long)nurbs_surface->m_cv_stride[1]);
    if (bVar1) {
      dStack_28 = -2.0;
      for (local_2c = 0; local_2c < 6; local_2c = local_2c + 1) {
        nurbs_surface->m_knot[1][local_2c] = dStack_28;
        nurbs_surface->m_knot[0][local_2c] = dStack_28;
        dStack_28 = dStack_28 + 1.0;
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDFace::GetQuadSurface(
class ON_NurbsSurface& nurbs_surface
  ) const
{
  if (false == nurbs_surface.Create(
    3, // dim
    false, // is_rat
    4, 4, // orders
    4, 4  // cv_counts
    ))
  {
    return false;
  }
  if (false == GetQuadSurface(nurbs_surface.m_cv, nurbs_surface.m_cv_stride[0], nurbs_surface.m_cv_stride[1]))
    return false;

  // evaluation domain will be [0,1] x [0,1]
  double k = -2.0;
  for (unsigned int i = 0; i < 6; i++)
  {
    nurbs_surface.m_knot[0][i] = nurbs_surface.m_knot[1][i] = k;
    k += 1.0;
  }

  return true;
}